

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmLocalGenerator *this_00;
  __type _Var3;
  bool bVar4;
  TargetType TVar5;
  string *make;
  string *makeArgs;
  string *path;
  ostream *poVar6;
  string *psVar7;
  cmValue cVar8;
  char *pcVar9;
  pointer puVar10;
  pointer puVar11;
  string_view str;
  string_view str_00;
  string_view str_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string fastTarget;
  string currentDir;
  undefined1 local_e8 [48];
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  cmAlphaNum local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = lg->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&local_a0);
  make = cmMakefile::GetRequiredDefinition(pcVar1,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"CMAKE_KATE_MAKE_ARGUMENTS",(allocator<char> *)&local_a0);
  makeArgs = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  poVar6 = std::operator<<((ostream *)fout,"\t\"build\": {\n\t\t\"directory\": \"");
  poVar6 = std::operator<<(poVar6,(string *)path);
  std::operator<<(poVar6,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar6 = std::operator<<((ostream *)fout,"\t\t\"build\": \"");
  poVar6 = std::operator<<(poVar6,(string *)make);
  poVar6 = std::operator<<(poVar6," -C \\\"");
  poVar6 = std::operator<<(poVar6,(string *)path);
  poVar6 = std::operator<<(poVar6,"\\\" ");
  poVar6 = std::operator<<(poVar6,(string *)makeArgs);
  poVar6 = std::operator<<(poVar6," ");
  std::operator<<(poVar6,"all\",\n");
  poVar6 = std::operator<<((ostream *)fout,"\t\t\"clean\": \"");
  poVar6 = std::operator<<(poVar6,(string *)make);
  poVar6 = std::operator<<(poVar6," -C \\\"");
  poVar6 = std::operator<<(poVar6,(string *)path);
  poVar6 = std::operator<<(poVar6,"\\\" ");
  poVar6 = std::operator<<(poVar6,(string *)makeArgs);
  poVar6 = std::operator<<(poVar6," ");
  std::operator<<(poVar6,"clean\",\n");
  poVar6 = std::operator<<((ostream *)fout,"\t\t\"quick\": \"");
  poVar6 = std::operator<<(poVar6,(string *)make);
  poVar6 = std::operator<<(poVar6," -C \\\"");
  poVar6 = std::operator<<(poVar6,(string *)path);
  poVar6 = std::operator<<(poVar6,"\\\" ");
  poVar6 = std::operator<<(poVar6,(string *)makeArgs);
  poVar6 = std::operator<<(poVar6," ");
  std::operator<<(poVar6,"install\",\n");
  std::operator<<((ostream *)fout,"\t\t\"targets\":[\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"all",(allocator<char> *)&local_a0);
  AppendTarget(this,fout,(string *)local_e8,make,makeArgs,path,path);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"clean",(allocator<char> *)&local_a0);
  AppendTarget(this,fout,(string *)local_e8,make,makeArgs,path,path);
  std::__cxx11::string::~string((string *)local_e8);
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  puVar10 = (pcVar2->LocalGenerators).
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (pcVar2->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar10 == local_b8) {
      std::operator<<((ostream *)fout,"\t] }\n");
      return;
    }
    this_00 = (puVar10->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
              super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
              super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)&local_50,(string *)psVar7);
    psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                       ((puVar10->_M_t).
                        super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    _Var3 = std::operator==(&local_50,psVar7);
    local_a8 = *(pointer *)
                ((long)&(this_00->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
    for (puVar11 = (this_00->GeneratorTargets).
                   super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != local_a8;
        puVar11 = puVar11 + 1) {
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((puVar11->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      TVar5 = cmGeneratorTarget::GetType
                        ((puVar11->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar5 < UTILITY) {
        AppendTarget(this,fout,psVar7,make,makeArgs,&local_50,path);
        local_e8._8_8_ = (psVar7->_M_dataplus)._M_p;
        local_e8._0_8_ = psVar7->_M_string_length;
        local_a0.View_._M_len = 5;
        local_a0.View_._M_str = "/fast";
        cmStrCat<>(&local_70,(cmAlphaNum *)local_e8,&local_a0);
        AppendTarget(this,fout,&local_70,make,makeArgs,&local_50,path);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else if (TVar5 == UTILITY) {
        str._M_str = (psVar7->_M_dataplus)._M_p;
        str._M_len = psVar7->_M_string_length;
        bVar4 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])0x5fe608);
        if (bVar4) {
          bVar4 = std::operator!=(psVar7,"Nightly");
          if (bVar4) goto LAB_003abf09;
        }
        str_00._M_str = (psVar7->_M_dataplus)._M_p;
        str_00._M_len = psVar7->_M_string_length;
        bVar4 = cmHasLiteralPrefix<11ul>(str_00,(char (*) [11])0x5fe504);
        if (bVar4) {
          bVar4 = std::operator!=(psVar7,"Continuous");
          if (bVar4) goto LAB_003abf09;
        }
        str_01._M_str = (psVar7->_M_dataplus)._M_p;
        str_01._M_len = psVar7->_M_string_length;
        bVar4 = cmHasLiteralPrefix<13ul>(str_01,(char (*) [13])0x5fe583);
        if (bVar4) {
          bVar4 = std::operator!=(psVar7,"Experimental");
          if (bVar4) goto LAB_003abf09;
        }
        AppendTarget(this,fout,psVar7,make,makeArgs,&local_50,path);
      }
      else if ((TVar5 == GLOBAL_TARGET) && (_Var3)) {
        bVar4 = std::operator==(psVar7,"edit_cache");
        if (bVar4) {
          pcVar1 = ((puVar10->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
          local_b0 = puVar10;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_e8,"CMAKE_EDIT_COMMAND",(allocator<char> *)&local_a0);
          cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_e8);
          std::__cxx11::string::~string((string *)local_e8);
          puVar10 = local_b0;
          if (cVar8.Value != (string *)0x0) {
            pcVar9 = strstr(((cVar8.Value)->_M_dataplus)._M_p,"ccmake");
            if (pcVar9 == (char *)0x0) goto LAB_003abf95;
          }
        }
        else {
LAB_003abf95:
          AppendTarget(this,fout,psVar7,make,makeArgs,&local_50,path);
        }
      }
LAB_003abf09:
    }
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (pointer)0x0;
    local_e8._16_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
    std::__cxx11::string::~string((string *)&local_50);
    puVar10 = puVar10 + 1;
  } while( true );
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator& lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg.GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg.GetBinaryDirectory();

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (const auto& localGen : this->GlobalGenerator->GetLocalGenerators()) {
    const auto& targets = localGen->GetGeneratorTargets();
    std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (const auto& target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              cmValue editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (!editCommand ||
                  strstr(editCommand->c_str(), "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                               homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(fout, fastTarget, make, makeArgs, currentDir,
                             homeOutputDir);

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, make, makeArgs, currentDir, homeOutputDir);
    }
  }

  fout << "\t] }\n";
}